

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O0

int CVodeGetLinWorkSpace(void *cvode_mem,long *lenrwLS,long *leniwLS)

{
  int iVar1;
  long *in_RDX;
  long *in_RSI;
  int retval;
  long liw;
  long lrw;
  sunindextype liw1;
  sunindextype lrw1;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  CVodeMem *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  SUNLinearSolver in_stack_ffffffffffffffb8;
  SUNMatrix in_stack_ffffffffffffffc0;
  int local_38;
  int local_34;
  long local_30;
  long local_28;
  int local_4;
  
  local_4 = cvLs_AccessLMem(in_stack_ffffffffffffffb8,
                            (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffa8,(CVLsMem *)0xefd0ae);
  if (local_4 == 0) {
    *in_RSI = 2;
    *in_RDX = 0x1e;
    if (*(long *)(*(long *)(*(long *)(local_28 + 0xe0) + 8) + 0x20) != 0) {
      N_VSpace((N_Vector)(ulong)in_stack_ffffffffffffffb0,(sunindextype *)in_stack_ffffffffffffffa8,
               (sunindextype *)0xefd110);
      *in_RSI = (long)(local_34 << 1) + *in_RSI;
      *in_RDX = (long)(local_38 << 1) + *in_RDX;
    }
    if (((*(long *)(local_30 + 0x58) != 0) &&
        (*(long *)(*(long *)(*(long *)(local_30 + 0x58) + 8) + 0x48) != 0)) &&
       (local_4 = SUNMatSpace(in_stack_ffffffffffffffc0,(long *)in_stack_ffffffffffffffb8,
                              (long *)CONCAT44(local_4,in_stack_ffffffffffffffb0)), local_4 == 0)) {
      *in_RSI = (long)&in_stack_ffffffffffffffc0->content + *in_RSI;
      *in_RDX = (long)&in_stack_ffffffffffffffb8->content + *in_RDX;
    }
    if ((*(long *)(*(long *)(*(long *)(local_30 + 0x48) + 8) + 0x60) != 0) &&
       (iVar1 = SUNLinSolSpace(in_stack_ffffffffffffffb8,
                               (long *)CONCAT44(local_4,in_stack_ffffffffffffffb0),
                               (long *)in_stack_ffffffffffffffa8), iVar1 == 0)) {
      *in_RSI = (long)&in_stack_ffffffffffffffc0->content + *in_RSI;
      *in_RDX = (long)&in_stack_ffffffffffffffb8->content + *in_RDX;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeGetLinWorkSpace(void *cvode_mem, long int *lenrwLS,
                         long int *leniwLS)
{
  CVodeMem     cv_mem;
  CVLsMem      cvls_mem;
  sunindextype lrw1, liw1;
  long int     lrw, liw;
  int          retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, "CVodeGetLinWorkSpace",
                           &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS)  return(retval);

  /* start with fixed sizes plus vector/matrix pointers */
  *lenrwLS = 2;
  *leniwLS = 30;

  /* add NVector sizes */
  if (cv_mem->cv_tempv->ops->nvspace) {
    N_VSpace(cv_mem->cv_tempv, &lrw1, &liw1);
    *lenrwLS += 2*lrw1;
    *leniwLS += 2*liw1;
  }

  /* add SUNMatrix size (only account for the one owned by Ls interface) */
  if (cvls_mem->savedJ)
    if (cvls_mem->savedJ->ops->space) {
      retval = SUNMatSpace(cvls_mem->savedJ, &lrw, &liw);
      if (retval == 0) {
        *lenrwLS += lrw;
        *leniwLS += liw;
      }
    }

  /* add LS sizes */
  if (cvls_mem->LS->ops->space) {
    retval = SUNLinSolSpace(cvls_mem->LS, &lrw, &liw);
    if (retval == 0) {
      *lenrwLS += lrw;
      *leniwLS += liw;
    }
  }

  return(CVLS_SUCCESS);
}